

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int iVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  float afVar11 [16];
  int aiVar12 [16];
  float afVar13 [16];
  float afVar14 [16];
  float afVar15 [16];
  float afVar16 [16];
  float afVar17 [16];
  float afVar18 [16];
  float afVar19 [16];
  float afVar20 [16];
  float afVar21 [16];
  float afVar22 [16];
  float afVar23 [16];
  float afVar24 [16];
  float afVar25 [16];
  float afVar26 [16];
  float afVar27 [16];
  float afVar28 [16];
  float afVar29 [16];
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  long lVar34;
  undefined1 (*pauVar35) [64];
  long lVar36;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar77 [32];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar33 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar84 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar85 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_C1,auVar84);
    auVar86 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_C2,auVar84);
    auVar87 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar88 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
    auVar84 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar84);
    lVar34 = 0;
    auVar89 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar90 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      afVar29 = ::_ps512_cephes_exp_p5;
      afVar28 = ::_ps512_cephes_exp_p4;
      afVar27 = ::_ps512_cephes_exp_p3;
      afVar26 = ::_ps512_cephes_exp_p2;
      afVar25 = ::_ps512_cephes_exp_p1;
      afVar24 = ::_ps512_cephes_exp_p0;
      afVar23 = ::_ps512_cephes_exp_C2;
      afVar22 = ::_ps512_cephes_exp_C1;
      afVar21 = ::_ps512_cephes_LOG2EF;
      afVar20 = ::_ps512_exp_lo;
      afVar19 = ::_ps512_exp_hi;
      afVar18 = _ps512_cephes_log_p6;
      afVar17 = _ps512_cephes_log_p5;
      afVar16 = _ps512_cephes_log_p4;
      afVar15 = _ps512_cephes_log_p3;
      afVar14 = _ps512_cephes_log_p0;
      afVar13 = _ps512_cephes_SQRTHF;
      aiVar12 = _ps512_min_norm_pos;
      afVar11 = ::_ps512_1;
      pauVar35 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar34 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar33 < 0x10) {
        uVar31 = 0;
      }
      else {
        iVar30 = 0xf;
        auVar88 = vmovdqa64_avx512f(auVar88);
        do {
          auVar91 = vminps_avx512f(*pauVar35,(undefined1  [64])afVar19);
          auVar91 = vmaxps_avx512f(auVar91,(undefined1  [64])afVar20);
          auVar92 = vfmadd213ps_avx512f((undefined1  [64])afVar21,auVar91,(undefined1  [64])afVar29)
          ;
          auVar93 = vrndscaleps_avx512f(auVar92,1);
          uVar6 = vcmpps_avx512f(auVar92,auVar93,1);
          auVar92 = vsubps_avx512f(auVar93,(undefined1  [64])afVar11);
          bVar4 = (bool)((byte)uVar6 & 1);
          auVar94._0_4_ = (uint)bVar4 * auVar92._0_4_ | (uint)!bVar4 * auVar93._0_4_;
          bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar94._4_4_ = (uint)bVar4 * auVar92._4_4_ | (uint)!bVar4 * auVar93._4_4_;
          bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar94._8_4_ = (uint)bVar4 * auVar92._8_4_ | (uint)!bVar4 * auVar93._8_4_;
          bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar94._12_4_ = (uint)bVar4 * auVar92._12_4_ | (uint)!bVar4 * auVar93._12_4_;
          bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar94._16_4_ = (uint)bVar4 * auVar92._16_4_ | (uint)!bVar4 * auVar93._16_4_;
          bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar94._20_4_ = (uint)bVar4 * auVar92._20_4_ | (uint)!bVar4 * auVar93._20_4_;
          bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar94._24_4_ = (uint)bVar4 * auVar92._24_4_ | (uint)!bVar4 * auVar93._24_4_;
          bVar4 = (bool)((byte)(uVar6 >> 7) & 1);
          auVar94._28_4_ = (uint)bVar4 * auVar92._28_4_ | (uint)!bVar4 * auVar93._28_4_;
          bVar4 = (bool)((byte)(uVar6 >> 8) & 1);
          auVar94._32_4_ = (uint)bVar4 * auVar92._32_4_ | (uint)!bVar4 * auVar93._32_4_;
          bVar4 = (bool)((byte)(uVar6 >> 9) & 1);
          auVar94._36_4_ = (uint)bVar4 * auVar92._36_4_ | (uint)!bVar4 * auVar93._36_4_;
          bVar4 = (bool)((byte)(uVar6 >> 10) & 1);
          auVar94._40_4_ = (uint)bVar4 * auVar92._40_4_ | (uint)!bVar4 * auVar93._40_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xb) & 1);
          auVar94._44_4_ = (uint)bVar4 * auVar92._44_4_ | (uint)!bVar4 * auVar93._44_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xc) & 1);
          auVar94._48_4_ = (uint)bVar4 * auVar92._48_4_ | (uint)!bVar4 * auVar93._48_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xd) & 1);
          auVar94._52_4_ = (uint)bVar4 * auVar92._52_4_ | (uint)!bVar4 * auVar93._52_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xe) & 1);
          auVar94._56_4_ = (uint)bVar4 * auVar92._56_4_ | (uint)!bVar4 * auVar93._56_4_;
          bVar4 = SUB81(uVar6 >> 0xf,0);
          auVar94._60_4_ = (uint)bVar4 * auVar92._60_4_ | (uint)!bVar4 * auVar93._60_4_;
          auVar91 = vfmadd231ps_avx512f(auVar91,auVar94,auVar85);
          auVar91 = vfmadd231ps_avx512f(auVar91,auVar94,auVar86);
          auVar92 = vmulps_avx512f(auVar91,auVar91);
          auVar93 = vfmadd213ps_avx512f(auVar91,(undefined1  [64])afVar24,(undefined1  [64])afVar25)
          ;
          auVar93 = vfmadd213ps_avx512f(auVar93,auVar91,(undefined1  [64])afVar26);
          auVar93 = vfmadd213ps_avx512f(auVar93,auVar91,(undefined1  [64])afVar27);
          auVar93 = vfmadd213ps_avx512f(auVar93,auVar91,(undefined1  [64])afVar28);
          auVar93 = vfmadd213ps_avx512f(auVar93,auVar91,(undefined1  [64])afVar29);
          auVar91 = vfmadd213ps_avx512f(auVar93,auVar92,auVar91);
          auVar91 = vaddps_avx512f(auVar91,(undefined1  [64])afVar11);
          auVar92 = vcvttps2dq_avx512f(auVar94);
          auVar92 = vpaddd_avx512f(auVar87,auVar92);
          auVar92 = vpslld_avx512f(auVar92,0x17);
          auVar91 = vfmadd213ps_avx512f(auVar92,auVar91,auVar89);
          auVar92 = vmaxps_avx512f(auVar91,(undefined1  [64])aiVar12);
          auVar93 = vpsrld_avx512f(auVar92,0x17);
          auVar92 = vpternlogd_avx512f(auVar92,auVar88,(undefined1  [64])afVar29,0xea);
          uVar6 = vcmpps_avx512f(auVar92,(undefined1  [64])afVar13,1);
          auVar94 = vsubps_avx512f(auVar92,(undefined1  [64])afVar11);
          auVar92 = vaddps_avx512f(auVar94,auVar92);
          bVar4 = (bool)((byte)uVar6 & 1);
          auVar95._0_4_ = (uint)bVar4 * auVar92._0_4_ | (uint)!bVar4 * auVar94._0_4_;
          bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar95._4_4_ = (uint)bVar4 * auVar92._4_4_ | (uint)!bVar4 * auVar94._4_4_;
          bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar95._8_4_ = (uint)bVar4 * auVar92._8_4_ | (uint)!bVar4 * auVar94._8_4_;
          bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar95._12_4_ = (uint)bVar4 * auVar92._12_4_ | (uint)!bVar4 * auVar94._12_4_;
          bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar95._16_4_ = (uint)bVar4 * auVar92._16_4_ | (uint)!bVar4 * auVar94._16_4_;
          bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar95._20_4_ = (uint)bVar4 * auVar92._20_4_ | (uint)!bVar4 * auVar94._20_4_;
          bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar95._24_4_ = (uint)bVar4 * auVar92._24_4_ | (uint)!bVar4 * auVar94._24_4_;
          bVar4 = (bool)((byte)(uVar6 >> 7) & 1);
          auVar95._28_4_ = (uint)bVar4 * auVar92._28_4_ | (uint)!bVar4 * auVar94._28_4_;
          bVar5 = (byte)(uVar6 >> 8);
          bVar4 = (bool)(bVar5 & 1);
          auVar95._32_4_ = (uint)bVar4 * auVar92._32_4_ | (uint)!bVar4 * auVar94._32_4_;
          bVar4 = (bool)((byte)(uVar6 >> 9) & 1);
          auVar95._36_4_ = (uint)bVar4 * auVar92._36_4_ | (uint)!bVar4 * auVar94._36_4_;
          bVar4 = (bool)((byte)(uVar6 >> 10) & 1);
          auVar95._40_4_ = (uint)bVar4 * auVar92._40_4_ | (uint)!bVar4 * auVar94._40_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xb) & 1);
          auVar95._44_4_ = (uint)bVar4 * auVar92._44_4_ | (uint)!bVar4 * auVar94._44_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xc) & 1);
          auVar95._48_4_ = (uint)bVar4 * auVar92._48_4_ | (uint)!bVar4 * auVar94._48_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xd) & 1);
          auVar95._52_4_ = (uint)bVar4 * auVar92._52_4_ | (uint)!bVar4 * auVar94._52_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xe) & 1);
          auVar95._56_4_ = (uint)bVar4 * auVar92._56_4_ | (uint)!bVar4 * auVar94._56_4_;
          bVar4 = SUB81(uVar6 >> 0xf,0);
          auVar95._60_4_ = (uint)bVar4 * auVar92._60_4_ | (uint)!bVar4 * auVar94._60_4_;
          auVar92 = vmulps_avx512f(auVar95,auVar95);
          auVar94 = vfmadd213ps_avx512f(auVar95,(undefined1  [64])afVar14,
                                        (undefined1  [64])_ps512_cephes_log_p1);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])_ps512_cephes_log_p2);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])afVar15);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])afVar16);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])afVar17);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])afVar18);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])_ps512_cephes_log_p7);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar95,(undefined1  [64])_ps512_cephes_log_p8);
          auVar96 = vmulps_avx512f(auVar92,auVar95);
          auVar94 = vfmadd213ps_avx512f(auVar96,auVar94,auVar95);
          uVar7 = vcmpps_avx512f(auVar91,_DAT_005ff400,2);
          auVar91 = vpsubd_avx512f(auVar93,auVar87);
          auVar91 = vcvtdq2ps_avx512f(auVar91);
          auVar93 = vaddps_avx512f(auVar91,(undefined1  [64])afVar11);
          bVar4 = (bool)((byte)uVar6 & 1);
          auVar96._0_4_ = (uint)bVar4 * auVar91._0_4_ | (uint)!bVar4 * auVar93._0_4_;
          bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar96._4_4_ = (uint)bVar4 * auVar91._4_4_ | (uint)!bVar4 * auVar93._4_4_;
          bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar96._8_4_ = (uint)bVar4 * auVar91._8_4_ | (uint)!bVar4 * auVar93._8_4_;
          bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar96._12_4_ = (uint)bVar4 * auVar91._12_4_ | (uint)!bVar4 * auVar93._12_4_;
          bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar96._16_4_ = (uint)bVar4 * auVar91._16_4_ | (uint)!bVar4 * auVar93._16_4_;
          bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar96._20_4_ = (uint)bVar4 * auVar91._20_4_ | (uint)!bVar4 * auVar93._20_4_;
          bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar96._24_4_ = (uint)bVar4 * auVar91._24_4_ | (uint)!bVar4 * auVar93._24_4_;
          bVar4 = (bool)((byte)(uVar6 >> 7) & 1);
          auVar96._28_4_ = (uint)bVar4 * auVar91._28_4_ | (uint)!bVar4 * auVar93._28_4_;
          bVar4 = (bool)(bVar5 & 1);
          auVar96._32_4_ = (uint)bVar4 * auVar91._32_4_ | (uint)!bVar4 * auVar93._32_4_;
          bVar4 = (bool)((byte)(uVar6 >> 9) & 1);
          auVar96._36_4_ = (uint)bVar4 * auVar91._36_4_ | (uint)!bVar4 * auVar93._36_4_;
          bVar4 = (bool)((byte)(uVar6 >> 10) & 1);
          auVar96._40_4_ = (uint)bVar4 * auVar91._40_4_ | (uint)!bVar4 * auVar93._40_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xb) & 1);
          auVar96._44_4_ = (uint)bVar4 * auVar91._44_4_ | (uint)!bVar4 * auVar93._44_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xc) & 1);
          auVar96._48_4_ = (uint)bVar4 * auVar91._48_4_ | (uint)!bVar4 * auVar93._48_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xd) & 1);
          auVar96._52_4_ = (uint)bVar4 * auVar91._52_4_ | (uint)!bVar4 * auVar93._52_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xe) & 1);
          auVar96._56_4_ = (uint)bVar4 * auVar91._56_4_ | (uint)!bVar4 * auVar93._56_4_;
          bVar4 = SUB81(uVar6 >> 0xf,0);
          auVar96._60_4_ = (uint)bVar4 * auVar91._60_4_ | (uint)!bVar4 * auVar93._60_4_;
          auVar91 = vfmadd231ps_avx512f(auVar94,auVar96,(undefined1  [64])afVar23);
          auVar91 = vfmadd231ps_avx512f(auVar91,auVar92,auVar84);
          auVar91 = vfmadd231ps_avx512f(auVar91,(undefined1  [64])afVar22,auVar96);
          auVar91 = vmulps_avx512f(auVar91,auVar90);
          auVar92 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar4 = (bool)((byte)uVar7 & 1);
          auVar93._0_4_ = (uint)bVar4 * auVar92._0_4_ | (uint)!bVar4 * auVar91._0_4_;
          bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
          auVar93._4_4_ = (uint)bVar4 * auVar92._4_4_ | (uint)!bVar4 * auVar91._4_4_;
          bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
          auVar93._8_4_ = (uint)bVar4 * auVar92._8_4_ | (uint)!bVar4 * auVar91._8_4_;
          bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
          auVar93._12_4_ = (uint)bVar4 * auVar92._12_4_ | (uint)!bVar4 * auVar91._12_4_;
          bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
          auVar93._16_4_ = (uint)bVar4 * auVar92._16_4_ | (uint)!bVar4 * auVar91._16_4_;
          bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
          auVar93._20_4_ = (uint)bVar4 * auVar92._20_4_ | (uint)!bVar4 * auVar91._20_4_;
          bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
          auVar93._24_4_ = (uint)bVar4 * auVar92._24_4_ | (uint)!bVar4 * auVar91._24_4_;
          bVar4 = (bool)((byte)(uVar7 >> 7) & 1);
          auVar93._28_4_ = (uint)bVar4 * auVar92._28_4_ | (uint)!bVar4 * auVar91._28_4_;
          bVar4 = (bool)((byte)(uVar7 >> 8) & 1);
          auVar93._32_4_ = (uint)bVar4 * auVar92._32_4_ | (uint)!bVar4 * auVar91._32_4_;
          bVar4 = (bool)((byte)(uVar7 >> 9) & 1);
          auVar93._36_4_ = (uint)bVar4 * auVar92._36_4_ | (uint)!bVar4 * auVar91._36_4_;
          bVar4 = (bool)((byte)(uVar7 >> 10) & 1);
          auVar93._40_4_ = (uint)bVar4 * auVar92._40_4_ | (uint)!bVar4 * auVar91._40_4_;
          bVar4 = (bool)((byte)(uVar7 >> 0xb) & 1);
          auVar93._44_4_ = (uint)bVar4 * auVar92._44_4_ | (uint)!bVar4 * auVar91._44_4_;
          bVar4 = (bool)((byte)(uVar7 >> 0xc) & 1);
          auVar93._48_4_ = (uint)bVar4 * auVar92._48_4_ | (uint)!bVar4 * auVar91._48_4_;
          bVar4 = (bool)((byte)(uVar7 >> 0xd) & 1);
          auVar93._52_4_ = (uint)bVar4 * auVar92._52_4_ | (uint)!bVar4 * auVar91._52_4_;
          bVar4 = (bool)((byte)(uVar7 >> 0xe) & 1);
          auVar93._56_4_ = (uint)bVar4 * auVar92._56_4_ | (uint)!bVar4 * auVar91._56_4_;
          bVar4 = SUB81(uVar7 >> 0xf,0);
          auVar93._60_4_ = (uint)bVar4 * auVar92._60_4_ | (uint)!bVar4 * auVar91._60_4_;
          auVar91 = vminps_avx512f(auVar93,(undefined1  [64])afVar19);
          auVar91 = vmaxps_avx512f(auVar91,(undefined1  [64])afVar20);
          auVar92 = vfmadd213ps_avx512f((undefined1  [64])afVar21,auVar91,(undefined1  [64])afVar29)
          ;
          auVar93 = vrndscaleps_avx512f(auVar92,1);
          uVar6 = vcmpps_avx512f(auVar92,auVar93,1);
          auVar94 = vsubps_avx512f(auVar93,(undefined1  [64])afVar11);
          bVar4 = (bool)((byte)uVar6 & 1);
          auVar92._0_4_ = (uint)bVar4 * auVar94._0_4_ | (uint)!bVar4 * auVar93._0_4_;
          bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar92._4_4_ = (uint)bVar4 * auVar94._4_4_ | (uint)!bVar4 * auVar93._4_4_;
          bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar92._8_4_ = (uint)bVar4 * auVar94._8_4_ | (uint)!bVar4 * auVar93._8_4_;
          bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar92._12_4_ = (uint)bVar4 * auVar94._12_4_ | (uint)!bVar4 * auVar93._12_4_;
          bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar92._16_4_ = (uint)bVar4 * auVar94._16_4_ | (uint)!bVar4 * auVar93._16_4_;
          bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar92._20_4_ = (uint)bVar4 * auVar94._20_4_ | (uint)!bVar4 * auVar93._20_4_;
          bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar92._24_4_ = (uint)bVar4 * auVar94._24_4_ | (uint)!bVar4 * auVar93._24_4_;
          bVar4 = (bool)((byte)(uVar6 >> 7) & 1);
          auVar92._28_4_ = (uint)bVar4 * auVar94._28_4_ | (uint)!bVar4 * auVar93._28_4_;
          bVar4 = (bool)((byte)(uVar6 >> 8) & 1);
          auVar92._32_4_ = (uint)bVar4 * auVar94._32_4_ | (uint)!bVar4 * auVar93._32_4_;
          bVar4 = (bool)((byte)(uVar6 >> 9) & 1);
          auVar92._36_4_ = (uint)bVar4 * auVar94._36_4_ | (uint)!bVar4 * auVar93._36_4_;
          bVar4 = (bool)((byte)(uVar6 >> 10) & 1);
          auVar92._40_4_ = (uint)bVar4 * auVar94._40_4_ | (uint)!bVar4 * auVar93._40_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xb) & 1);
          auVar92._44_4_ = (uint)bVar4 * auVar94._44_4_ | (uint)!bVar4 * auVar93._44_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xc) & 1);
          auVar92._48_4_ = (uint)bVar4 * auVar94._48_4_ | (uint)!bVar4 * auVar93._48_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xd) & 1);
          auVar92._52_4_ = (uint)bVar4 * auVar94._52_4_ | (uint)!bVar4 * auVar93._52_4_;
          bVar4 = (bool)((byte)(uVar6 >> 0xe) & 1);
          auVar92._56_4_ = (uint)bVar4 * auVar94._56_4_ | (uint)!bVar4 * auVar93._56_4_;
          bVar4 = SUB81(uVar6 >> 0xf,0);
          auVar92._60_4_ = (uint)bVar4 * auVar94._60_4_ | (uint)!bVar4 * auVar93._60_4_;
          auVar91 = vfmadd231ps_avx512f(auVar91,auVar92,auVar85);
          auVar91 = vfmadd231ps_avx512f(auVar91,auVar92,auVar86);
          auVar93 = vmulps_avx512f(auVar91,auVar91);
          auVar94 = vfmadd213ps_avx512f(auVar91,(undefined1  [64])afVar24,(undefined1  [64])afVar25)
          ;
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar91,(undefined1  [64])afVar26);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar91,(undefined1  [64])afVar27);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar91,(undefined1  [64])afVar28);
          auVar94 = vfmadd213ps_avx512f(auVar94,auVar91,(undefined1  [64])afVar29);
          auVar91 = vfmadd213ps_avx512f(auVar94,auVar93,auVar91);
          auVar91 = vaddps_avx512f(auVar91,(undefined1  [64])afVar11);
          auVar92 = vcvttps2dq_avx512f(auVar92);
          auVar92 = vpaddd_avx512f(auVar92,auVar87);
          auVar92 = vpslld_avx512f(auVar92,0x17);
          auVar91 = vfmadd213ps_avx512f(auVar92,auVar91,auVar89);
          auVar91 = vdivps_avx512f(auVar89,auVar91);
          auVar91 = vfnmsub213ps_avx512f(auVar91,auVar90,auVar89);
          auVar91 = vmulps_avx512f(auVar91,*pauVar35);
          *pauVar35 = auVar91;
          pauVar35 = pauVar35 + 1;
          iVar30 = iVar30 + 0x10;
          uVar31 = uVar33 & 0xfffffff0;
        } while (iVar30 < (int)uVar33);
      }
      uVar32 = uVar31 | 7;
      auVar117._8_4_ = 0x42b0c0a5;
      auVar117._0_8_ = 0x42b0c0a542b0c0a5;
      auVar117._12_4_ = 0x42b0c0a5;
      auVar117._16_4_ = 0x42b0c0a5;
      auVar117._20_4_ = 0x42b0c0a5;
      auVar117._24_4_ = 0x42b0c0a5;
      auVar117._28_4_ = 0x42b0c0a5;
      auVar119._8_4_ = 0xc2b0c0a5;
      auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar119._12_4_ = 0xc2b0c0a5;
      auVar119._16_4_ = 0xc2b0c0a5;
      auVar119._20_4_ = 0xc2b0c0a5;
      auVar119._24_4_ = 0xc2b0c0a5;
      auVar119._28_4_ = 0xc2b0c0a5;
      auVar121._8_4_ = 0x3f000000;
      auVar121._0_8_ = 0x3f0000003f000000;
      auVar121._12_4_ = 0x3f000000;
      auVar121._16_4_ = 0x3f000000;
      auVar121._20_4_ = 0x3f000000;
      auVar121._24_4_ = 0x3f000000;
      auVar121._28_4_ = 0x3f000000;
      auVar123._8_4_ = 0x3fb8aa3b;
      auVar123._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar123._12_4_ = 0x3fb8aa3b;
      auVar123._16_4_ = 0x3fb8aa3b;
      auVar123._20_4_ = 0x3fb8aa3b;
      auVar123._24_4_ = 0x3fb8aa3b;
      auVar123._28_4_ = 0x3fb8aa3b;
      auVar127._8_4_ = 0x3f800000;
      auVar127._0_8_ = 0x3f8000003f800000;
      auVar127._12_4_ = 0x3f800000;
      auVar127._16_4_ = 0x3f800000;
      auVar127._20_4_ = 0x3f800000;
      auVar127._24_4_ = 0x3f800000;
      auVar127._28_4_ = 0x3f800000;
      auVar129._8_4_ = 0x3f318000;
      auVar129._0_8_ = 0x3f3180003f318000;
      auVar129._12_4_ = 0x3f318000;
      auVar129._16_4_ = 0x3f318000;
      auVar129._20_4_ = 0x3f318000;
      auVar129._24_4_ = 0x3f318000;
      auVar129._28_4_ = 0x3f318000;
      auVar132._8_4_ = 0xb95e8083;
      auVar132._0_8_ = 0xb95e8083b95e8083;
      auVar132._12_4_ = 0xb95e8083;
      auVar132._16_4_ = 0xb95e8083;
      auVar132._20_4_ = 0xb95e8083;
      auVar132._24_4_ = 0xb95e8083;
      auVar132._28_4_ = 0xb95e8083;
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar68 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar125._8_4_ = 0x3e11e9bf;
      auVar125._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar125._12_4_ = 0x3e11e9bf;
      auVar125._16_4_ = 0x3e11e9bf;
      auVar125._20_4_ = 0x3e11e9bf;
      auVar125._24_4_ = 0x3e11e9bf;
      auVar125._28_4_ = 0x3e11e9bf;
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
      while ((int)uVar32 < (int)uVar33) {
        auVar2 = *(undefined1 (*) [32])*pauVar35;
        auVar78 = vminps_avx(auVar2,auVar117);
        auVar78 = vmaxps_avx(auVar78,auVar119);
        auVar37 = vfmadd213ps_fma(auVar123,auVar78,auVar121);
        auVar79 = vroundps_avx(ZEXT1632(auVar37),1);
        uVar6 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar79,1);
        auVar76 = vsubps_avx512vl(auVar79,auVar127);
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar77._0_4_ = (float)((uint)bVar4 * auVar76._0_4_ | (uint)!bVar4 * auVar79._0_4_);
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar77._4_4_ = (float)((uint)bVar4 * auVar76._4_4_ | (uint)!bVar4 * auVar79._4_4_);
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar77._8_4_ = (float)((uint)bVar4 * auVar76._8_4_ | (uint)!bVar4 * auVar79._8_4_);
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar77._12_4_ = (float)((uint)bVar4 * auVar76._12_4_ | (uint)!bVar4 * auVar79._12_4_);
        bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar77._16_4_ = (float)((uint)bVar4 * auVar76._16_4_ | (uint)!bVar4 * auVar79._16_4_);
        bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar77._20_4_ = (float)((uint)bVar4 * auVar76._20_4_ | (uint)!bVar4 * auVar79._20_4_);
        bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar77._24_4_ = (float)((uint)bVar4 * auVar76._24_4_ | (uint)!bVar4 * auVar79._24_4_);
        bVar4 = SUB81(uVar6 >> 7,0);
        auVar77._28_4_ = (float)((uint)bVar4 * auVar76._28_4_ | (uint)!bVar4 * auVar79._28_4_);
        auVar37 = vfmsub231ps_fma(auVar78,auVar77,auVar129);
        auVar38 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar77,auVar132);
        auVar79 = ZEXT1632(auVar38);
        auVar78 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar60);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar62);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar63);
        auVar79 = ZEXT1632(auVar38);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar64);
        auVar37 = vfmadd213ps_fma(auVar78,auVar79,auVar121);
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),
                                  ZEXT1632(CONCAT412(auVar38._12_4_ * auVar38._12_4_,
                                                     CONCAT48(auVar38._8_4_ * auVar38._8_4_,
                                                              CONCAT44(auVar38._4_4_ * auVar38._4_4_
                                                                       ,auVar38._0_4_ *
                                                                        auVar38._0_4_)))),auVar79);
        auVar101._0_4_ = auVar37._0_4_ + 1.0;
        auVar101._4_4_ = auVar37._4_4_ + 1.0;
        auVar101._8_4_ = auVar37._8_4_ + 1.0;
        auVar101._12_4_ = auVar37._12_4_ + 1.0;
        auVar101._16_4_ = 0x3f800000;
        auVar101._20_4_ = 0x3f800000;
        auVar101._24_4_ = 0x3f800000;
        auVar101._28_4_ = 0x3f800000;
        auVar108._0_4_ = (int)auVar77._0_4_;
        auVar108._4_4_ = (int)auVar77._4_4_;
        auVar108._8_4_ = (int)auVar77._8_4_;
        auVar108._12_4_ = (int)auVar77._12_4_;
        auVar108._16_4_ = (int)auVar77._16_4_;
        auVar108._20_4_ = (int)auVar77._20_4_;
        auVar108._24_4_ = (int)auVar77._24_4_;
        auVar108._28_4_ = (int)auVar77._28_4_;
        auVar78 = vpslld_avx2(auVar108,0x17);
        auVar78 = vpaddd_avx512vl(auVar78,auVar65);
        auVar37 = vfmadd213ps_fma(auVar78,auVar101,auVar127);
        uVar6 = vcmpps_avx512vl(ZEXT1632(auVar37),_DAT_005f42e0,2);
        auVar78._8_4_ = 0x800000;
        auVar78._0_8_ = 0x80000000800000;
        auVar78._12_4_ = 0x800000;
        auVar78._16_4_ = 0x800000;
        auVar78._20_4_ = 0x800000;
        auVar78._24_4_ = 0x800000;
        auVar78._28_4_ = 0x800000;
        auVar78 = vmaxps_avx512vl(ZEXT1632(auVar37),auVar78);
        auVar109 = vpsrld_avx2(auVar78,0x17);
        auVar114._8_4_ = 0x807fffff;
        auVar114._0_8_ = 0x807fffff807fffff;
        auVar114._12_4_ = 0x807fffff;
        auVar114._16_4_ = 0x807fffff;
        auVar114._20_4_ = 0x807fffff;
        auVar114._24_4_ = 0x807fffff;
        auVar114._28_4_ = 0x807fffff;
        auVar79._8_4_ = 0x3f000000;
        auVar79._0_8_ = 0x3f0000003f000000;
        auVar79._12_4_ = 0x3f000000;
        auVar79._16_4_ = 0x3f000000;
        auVar79._20_4_ = 0x3f000000;
        auVar79._24_4_ = 0x3f000000;
        auVar79._28_4_ = 0x3f000000;
        auVar78 = vpternlogd_avx512vl(auVar78,auVar114,auVar79,0xea);
        auVar76._8_4_ = 0x3f3504f3;
        auVar76._0_8_ = 0x3f3504f33f3504f3;
        auVar76._12_4_ = 0x3f3504f3;
        auVar76._16_4_ = 0x3f3504f3;
        auVar76._20_4_ = 0x3f3504f3;
        auVar76._24_4_ = 0x3f3504f3;
        auVar76._28_4_ = 0x3f3504f3;
        uVar7 = vcmpps_avx512vl(auVar78,auVar76,1);
        auVar79 = vaddps_avx512vl(auVar78,auVar66);
        auVar76 = vaddps_avx512vl(auVar79,auVar78);
        bVar4 = (bool)((byte)uVar7 & 1);
        auVar80._0_4_ = (float)((uint)bVar4 * auVar76._0_4_ | (uint)!bVar4 * auVar79._0_4_);
        bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar80._4_4_ = (float)((uint)bVar4 * auVar76._4_4_ | (uint)!bVar4 * auVar79._4_4_);
        bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar80._8_4_ = (float)((uint)bVar4 * auVar76._8_4_ | (uint)!bVar4 * auVar79._8_4_);
        bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar80._12_4_ = (float)((uint)bVar4 * auVar76._12_4_ | (uint)!bVar4 * auVar79._12_4_);
        bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
        auVar80._16_4_ = (float)((uint)bVar4 * auVar76._16_4_ | (uint)!bVar4 * auVar79._16_4_);
        bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
        auVar80._20_4_ = (float)((uint)bVar4 * auVar76._20_4_ | (uint)!bVar4 * auVar79._20_4_);
        bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
        auVar80._24_4_ = (float)((uint)bVar4 * auVar76._24_4_ | (uint)!bVar4 * auVar79._24_4_);
        bVar4 = SUB81(uVar7 >> 7,0);
        auVar80._28_4_ = (uint)bVar4 * auVar76._28_4_ | (uint)!bVar4 * auVar79._28_4_;
        auVar9._4_4_ = auVar80._4_4_ * auVar80._4_4_;
        auVar9._0_4_ = auVar80._0_4_ * auVar80._0_4_;
        auVar9._8_4_ = auVar80._8_4_ * auVar80._8_4_;
        auVar9._12_4_ = auVar80._12_4_ * auVar80._12_4_;
        auVar9._16_4_ = auVar80._16_4_ * auVar80._16_4_;
        auVar9._20_4_ = auVar80._20_4_ * auVar80._20_4_;
        auVar9._24_4_ = auVar80._24_4_ * auVar80._24_4_;
        auVar9._28_4_ = auVar78._28_4_;
        auVar78 = vfmadd213ps_avx512vl(auVar67,auVar80,auVar68);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar80,auVar69);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar80,auVar70);
        auVar37 = vfmadd213ps_fma(auVar78,auVar80,auVar125);
        auVar78 = vfmadd213ps_avx512vl(ZEXT1632(auVar37),auVar80,auVar71);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar80,auVar72);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar80,auVar73);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar80,auVar74);
        auVar10._4_4_ = auVar80._4_4_ * auVar80._4_4_ * auVar80._4_4_ * auVar78._4_4_;
        auVar10._0_4_ = auVar80._0_4_ * auVar80._0_4_ * auVar80._0_4_ * auVar78._0_4_;
        auVar10._8_4_ = auVar80._8_4_ * auVar80._8_4_ * auVar80._8_4_ * auVar78._8_4_;
        auVar10._12_4_ = auVar80._12_4_ * auVar80._12_4_ * auVar80._12_4_ * auVar78._12_4_;
        auVar10._16_4_ = auVar80._16_4_ * auVar80._16_4_ * auVar80._16_4_ * auVar78._16_4_;
        auVar10._20_4_ = auVar80._20_4_ * auVar80._20_4_ * auVar80._20_4_ * auVar78._20_4_;
        auVar10._24_4_ = auVar80._24_4_ * auVar80._24_4_ * auVar80._24_4_ * auVar78._24_4_;
        auVar10._28_4_ = auVar78._28_4_;
        auVar8._8_4_ = 0xffffff82;
        auVar8._0_8_ = 0xffffff82ffffff82;
        auVar8._12_4_ = 0xffffff82;
        auVar8._16_4_ = 0xffffff82;
        auVar8._20_4_ = 0xffffff82;
        auVar8._24_4_ = 0xffffff82;
        auVar8._28_4_ = 0xffffff82;
        auVar78 = vpaddd_avx512vl(auVar109,auVar8);
        auVar78 = vcvtdq2ps_avx(auVar78);
        auVar79 = vsubps_avx512vl(auVar78,auVar127);
        bVar4 = (bool)((byte)uVar7 & 1);
        auVar81._0_4_ = (uint)bVar4 * auVar79._0_4_ | (uint)!bVar4 * auVar78._0_4_;
        bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar81._4_4_ = (uint)bVar4 * auVar79._4_4_ | (uint)!bVar4 * auVar78._4_4_;
        bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar81._8_4_ = (uint)bVar4 * auVar79._8_4_ | (uint)!bVar4 * auVar78._8_4_;
        bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar81._12_4_ = (uint)bVar4 * auVar79._12_4_ | (uint)!bVar4 * auVar78._12_4_;
        bVar4 = (bool)((byte)(uVar7 >> 4) & 1);
        auVar81._16_4_ = (uint)bVar4 * auVar79._16_4_ | (uint)!bVar4 * auVar78._16_4_;
        bVar4 = (bool)((byte)(uVar7 >> 5) & 1);
        auVar81._20_4_ = (uint)bVar4 * auVar79._20_4_ | (uint)!bVar4 * auVar78._20_4_;
        bVar4 = (bool)((byte)(uVar7 >> 6) & 1);
        auVar81._24_4_ = (uint)bVar4 * auVar79._24_4_ | (uint)!bVar4 * auVar78._24_4_;
        bVar4 = SUB81(uVar7 >> 7,0);
        auVar81._28_4_ = (uint)bVar4 * auVar79._28_4_ | (uint)!bVar4 * auVar78._28_4_;
        auVar37 = vfmadd231ps_fma(auVar10,auVar81,auVar132);
        auVar37 = vfmsub231ps_fma(ZEXT1632(auVar37),auVar121,auVar9);
        auVar78 = vsubps_avx(ZEXT1632(auVar37),auVar80);
        auVar37 = vfmsub231ps_fma(auVar78,auVar129,auVar81);
        auVar78 = vmulps_avx512vl(ZEXT1632(auVar37),auVar75);
        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar82._0_4_ = (uint)bVar4 * auVar79._0_4_ | (uint)!bVar4 * auVar78._0_4_;
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar82._4_4_ = (uint)bVar4 * auVar79._4_4_ | (uint)!bVar4 * auVar78._4_4_;
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar82._8_4_ = (uint)bVar4 * auVar79._8_4_ | (uint)!bVar4 * auVar78._8_4_;
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar82._12_4_ = (uint)bVar4 * auVar79._12_4_ | (uint)!bVar4 * auVar78._12_4_;
        bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar82._16_4_ = (uint)bVar4 * auVar79._16_4_ | (uint)!bVar4 * auVar78._16_4_;
        bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar82._20_4_ = (uint)bVar4 * auVar79._20_4_ | (uint)!bVar4 * auVar78._20_4_;
        bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar82._24_4_ = (uint)bVar4 * auVar79._24_4_ | (uint)!bVar4 * auVar78._24_4_;
        bVar4 = SUB81(uVar6 >> 7,0);
        auVar82._28_4_ = (uint)bVar4 * auVar79._28_4_ | (uint)!bVar4 * auVar78._28_4_;
        auVar78 = vminps_avx(auVar82,auVar117);
        auVar78 = vmaxps_avx(auVar78,auVar119);
        auVar37 = vfmadd213ps_fma(auVar123,auVar78,auVar121);
        auVar79 = vroundps_avx(ZEXT1632(auVar37),1);
        uVar6 = vcmpps_avx512vl(ZEXT1632(auVar37),auVar79,1);
        auVar76 = vsubps_avx512vl(auVar79,auVar127);
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar83._0_4_ = (float)((uint)bVar4 * auVar76._0_4_ | (uint)!bVar4 * auVar79._0_4_);
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar83._4_4_ = (float)((uint)bVar4 * auVar76._4_4_ | (uint)!bVar4 * auVar79._4_4_);
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar83._8_4_ = (float)((uint)bVar4 * auVar76._8_4_ | (uint)!bVar4 * auVar79._8_4_);
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar83._12_4_ = (float)((uint)bVar4 * auVar76._12_4_ | (uint)!bVar4 * auVar79._12_4_);
        bVar4 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar83._16_4_ = (float)((uint)bVar4 * auVar76._16_4_ | (uint)!bVar4 * auVar79._16_4_);
        bVar4 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar83._20_4_ = (float)((uint)bVar4 * auVar76._20_4_ | (uint)!bVar4 * auVar79._20_4_);
        bVar4 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar83._24_4_ = (float)((uint)bVar4 * auVar76._24_4_ | (uint)!bVar4 * auVar79._24_4_);
        bVar4 = SUB81(uVar6 >> 7,0);
        auVar83._28_4_ = (float)((uint)bVar4 * auVar76._28_4_ | (uint)!bVar4 * auVar79._28_4_);
        auVar37 = vfmsub231ps_fma(auVar78,auVar83,auVar129);
        auVar38 = vfnmsub231ps_fma(ZEXT1632(auVar37),auVar83,auVar132);
        auVar79 = ZEXT1632(auVar38);
        auVar78 = vfmadd213ps_avx512vl(auVar61,auVar79,auVar60);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar62);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar63);
        auVar79 = ZEXT1632(auVar38);
        auVar78 = vfmadd213ps_avx512vl(auVar78,auVar79,auVar64);
        auVar37 = vfmadd213ps_fma(auVar78,auVar79,auVar121);
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),
                                  ZEXT1632(CONCAT412(auVar38._12_4_ * auVar38._12_4_,
                                                     CONCAT48(auVar38._8_4_ * auVar38._8_4_,
                                                              CONCAT44(auVar38._4_4_ * auVar38._4_4_
                                                                       ,auVar38._0_4_ *
                                                                        auVar38._0_4_)))),auVar79);
        auVar102._0_4_ = auVar37._0_4_ + 1.0;
        auVar102._4_4_ = auVar37._4_4_ + 1.0;
        auVar102._8_4_ = auVar37._8_4_ + 1.0;
        auVar102._12_4_ = auVar37._12_4_ + 1.0;
        auVar102._16_4_ = 0x3f800000;
        auVar102._20_4_ = 0x3f800000;
        auVar102._24_4_ = 0x3f800000;
        auVar102._28_4_ = 0x3f800000;
        auVar110._0_4_ = (int)auVar83._0_4_;
        auVar110._4_4_ = (int)auVar83._4_4_;
        auVar110._8_4_ = (int)auVar83._8_4_;
        auVar110._12_4_ = (int)auVar83._12_4_;
        auVar110._16_4_ = (int)auVar83._16_4_;
        auVar110._20_4_ = (int)auVar83._20_4_;
        auVar110._24_4_ = (int)auVar83._24_4_;
        auVar110._28_4_ = (int)auVar83._28_4_;
        auVar78 = vpslld_avx2(auVar110,0x17);
        auVar78 = vpaddd_avx512vl(auVar78,auVar65);
        auVar37 = vfmadd213ps_fma(auVar78,auVar102,auVar127);
        auVar78 = vdivps_avx(auVar127,ZEXT1632(auVar37));
        auVar78 = vfnmadd213ps_avx512vl(auVar78,auVar75,auVar66);
        auVar109._4_4_ = auVar78._4_4_ * auVar2._4_4_;
        auVar109._0_4_ = auVar78._0_4_ * auVar2._0_4_;
        auVar109._8_4_ = auVar78._8_4_ * auVar2._8_4_;
        auVar109._12_4_ = auVar78._12_4_ * auVar2._12_4_;
        auVar109._16_4_ = auVar78._16_4_ * auVar2._16_4_;
        auVar109._20_4_ = auVar78._20_4_ * auVar2._20_4_;
        auVar109._24_4_ = auVar78._24_4_ * auVar2._24_4_;
        auVar109._28_4_ = auVar2._28_4_;
        *(undefined1 (*) [32])*pauVar35 = auVar109;
        pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x20);
        uVar32 = uVar31 + 0xf;
        uVar31 = uVar31 + 8;
      }
      uVar32 = uVar31 | 3;
      auVar116._8_4_ = 0x42b0c0a5;
      auVar116._0_8_ = 0x42b0c0a542b0c0a5;
      auVar116._12_4_ = 0x42b0c0a5;
      auVar118._8_4_ = 0xc2b0c0a5;
      auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar118._12_4_ = 0xc2b0c0a5;
      auVar120._8_4_ = 0x3fb8aa3b;
      auVar120._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar120._12_4_ = 0x3fb8aa3b;
      auVar122._8_4_ = 0x3f000000;
      auVar122._0_8_ = 0x3f0000003f000000;
      auVar122._12_4_ = 0x3f000000;
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar126._8_4_ = 0x3f318000;
      auVar126._0_8_ = 0x3f3180003f318000;
      auVar126._12_4_ = 0x3f318000;
      auVar128._8_4_ = 0xb95e8083;
      auVar128._0_8_ = 0xb95e8083b95e8083;
      auVar128._12_4_ = 0xb95e8083;
      auVar130._8_4_ = 0x3ab743ce;
      auVar130._0_8_ = 0x3ab743ce3ab743ce;
      auVar130._12_4_ = 0x3ab743ce;
      auVar131._8_4_ = 0x39506967;
      auVar131._0_8_ = 0x3950696739506967;
      auVar131._12_4_ = 0x39506967;
      auVar133._8_4_ = 0x3c088908;
      auVar133._0_8_ = 0x3c0889083c088908;
      auVar133._12_4_ = 0x3c088908;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar51 = vpxord_avx512vl(auVar65._0_16_,auVar65._0_16_);
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      while ((int)uVar32 < (int)uVar33) {
        auVar1 = *(undefined1 (*) [16])*pauVar35;
        auVar54 = vminps_avx(auVar1,auVar116);
        auVar55 = vmaxps_avx(auVar54,auVar118);
        auVar53 = vfmadd213ps_fma(auVar120,auVar55,auVar122);
        auVar111._0_4_ = (int)auVar53._0_4_;
        auVar111._4_4_ = (int)auVar53._4_4_;
        auVar111._8_4_ = (int)auVar53._8_4_;
        auVar111._12_4_ = (int)auVar53._12_4_;
        auVar54 = vcvtdq2ps_avx(auVar111);
        uVar6 = vcmpps_avx512vl(auVar53,auVar54,1);
        auVar53 = vsubps_avx512vl(auVar54,auVar124);
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar105._0_4_ = (float)((uint)bVar4 * auVar53._0_4_ | (uint)!bVar4 * auVar54._0_4_);
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * auVar54._4_4_);
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar4 * auVar53._8_4_ | (uint)!bVar4 * auVar54._8_4_);
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar4 * auVar53._12_4_ | (uint)!bVar4 * auVar54._12_4_);
        auVar54 = vfmsub231ps_fma(auVar55,auVar105,auVar126);
        auVar55 = vfnmsub231ps_fma(auVar54,auVar105,auVar128);
        auVar103._0_4_ = auVar55._0_4_ * auVar55._0_4_;
        auVar103._4_4_ = auVar55._4_4_ * auVar55._4_4_;
        auVar103._8_4_ = auVar55._8_4_ * auVar55._8_4_;
        auVar103._12_4_ = auVar55._12_4_ * auVar55._12_4_;
        auVar54 = vfmadd213ps_fma(auVar131,auVar55,auVar130);
        auVar54 = vfmadd213ps_fma(auVar54,auVar55,auVar133);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar37);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar38);
        auVar54 = vfmadd213ps_fma(auVar54,auVar55,auVar122);
        auVar54 = vfmadd213ps_fma(auVar54,auVar103,auVar55);
        auVar98._0_4_ = auVar54._0_4_ + 1.0;
        auVar98._4_4_ = auVar54._4_4_ + 1.0;
        auVar98._8_4_ = auVar54._8_4_ + 1.0;
        auVar98._12_4_ = auVar54._12_4_ + 1.0;
        auVar104._0_4_ = (int)auVar105._0_4_;
        auVar104._4_4_ = (int)auVar105._4_4_;
        auVar104._8_4_ = (int)auVar105._8_4_;
        auVar104._12_4_ = (int)auVar105._12_4_;
        auVar54 = vpslld_avx(auVar104,0x17);
        auVar54 = vpaddd_avx512vl(auVar54,auVar39);
        auVar54 = vfmadd213ps_fma(auVar54,auVar98,auVar124);
        uVar6 = vcmpps_avx512vl(auVar54,auVar51,2);
        auVar55._8_4_ = 0x800000;
        auVar55._0_8_ = 0x80000000800000;
        auVar55._12_4_ = 0x800000;
        auVar55 = vmaxps_avx512vl(auVar54,auVar55);
        auVar105 = vpsrld_avx(auVar55,0x17);
        auVar112._8_4_ = 0x807fffff;
        auVar112._0_8_ = 0x807fffff807fffff;
        auVar112._12_4_ = 0x807fffff;
        auVar54._8_4_ = 0x3f000000;
        auVar54._0_8_ = 0x3f0000003f000000;
        auVar54._12_4_ = 0x3f000000;
        auVar54 = vpternlogd_avx512vl(auVar55,auVar112,auVar54,0xea);
        uVar7 = vcmpps_avx512vl(auVar54,auVar40,1);
        auVar55 = vaddps_avx512vl(auVar54,auVar41);
        auVar54 = vaddps_avx512vl(auVar55,auVar54);
        bVar4 = (bool)((byte)uVar7 & 1);
        auVar56._0_4_ = (float)((uint)bVar4 * auVar54._0_4_ | (uint)!bVar4 * auVar55._0_4_);
        bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar56._4_4_ = (float)((uint)bVar4 * auVar54._4_4_ | (uint)!bVar4 * auVar55._4_4_);
        bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar56._8_4_ = (float)((uint)bVar4 * auVar54._8_4_ | (uint)!bVar4 * auVar55._8_4_);
        bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar56._12_4_ = (float)((uint)bVar4 * auVar54._12_4_ | (uint)!bVar4 * auVar55._12_4_);
        auVar99._0_4_ = auVar56._0_4_ * auVar56._0_4_;
        auVar99._4_4_ = auVar56._4_4_ * auVar56._4_4_;
        auVar99._8_4_ = auVar56._8_4_ * auVar56._8_4_;
        auVar99._12_4_ = auVar56._12_4_ * auVar56._12_4_;
        auVar54 = vfmadd213ps_avx512vl(auVar42,auVar56,auVar43);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar44);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar45);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar46);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar47);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar48);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar49);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar56,auVar50);
        auVar115._0_4_ = auVar99._0_4_ * auVar56._0_4_ * auVar54._0_4_;
        auVar115._4_4_ = auVar99._4_4_ * auVar56._4_4_ * auVar54._4_4_;
        auVar115._8_4_ = auVar99._8_4_ * auVar56._8_4_ * auVar54._8_4_;
        auVar115._12_4_ = auVar99._12_4_ * auVar56._12_4_ * auVar54._12_4_;
        auVar53._8_4_ = 0xffffff82;
        auVar53._0_8_ = 0xffffff82ffffff82;
        auVar53._12_4_ = 0xffffff82;
        auVar54 = vpaddd_avx512vl(auVar105,auVar53);
        auVar54 = vcvtdq2ps_avx(auVar54);
        auVar55 = vsubps_avx512vl(auVar54,auVar124);
        bVar4 = (bool)((byte)uVar7 & 1);
        auVar57._0_4_ = (uint)bVar4 * auVar55._0_4_ | (uint)!bVar4 * auVar54._0_4_;
        bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar4 * auVar55._4_4_ | (uint)!bVar4 * auVar54._4_4_;
        bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar4 * auVar55._8_4_ | (uint)!bVar4 * auVar54._8_4_;
        bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
        auVar57._12_4_ = (uint)bVar4 * auVar55._12_4_ | (uint)!bVar4 * auVar54._12_4_;
        auVar54 = vfmadd231ps_fma(auVar115,auVar57,auVar128);
        auVar54 = vfmsub231ps_fma(auVar54,auVar122,auVar99);
        auVar54 = vsubps_avx(auVar54,auVar56);
        auVar54 = vfnmadd231ps_fma(auVar54,auVar126,auVar57);
        auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar58._0_4_ =
             (uint)bVar4 * auVar55._0_4_ | (uint)!bVar4 * (int)(auVar54._0_4_ + auVar54._0_4_);
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar58._4_4_ =
             (uint)bVar4 * auVar55._4_4_ | (uint)!bVar4 * (int)(auVar54._4_4_ + auVar54._4_4_);
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar58._8_4_ =
             (uint)bVar4 * auVar55._8_4_ | (uint)!bVar4 * (int)(auVar54._8_4_ + auVar54._8_4_);
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar58._12_4_ =
             (uint)bVar4 * auVar55._12_4_ | (uint)!bVar4 * (int)(auVar54._12_4_ + auVar54._12_4_);
        auVar54 = vminps_avx(auVar58,auVar116);
        auVar55 = vmaxps_avx(auVar54,auVar118);
        auVar53 = vfmadd213ps_fma(auVar120,auVar55,auVar122);
        auVar113._0_4_ = (int)auVar53._0_4_;
        auVar113._4_4_ = (int)auVar53._4_4_;
        auVar113._8_4_ = (int)auVar53._8_4_;
        auVar113._12_4_ = (int)auVar53._12_4_;
        auVar54 = vcvtdq2ps_avx(auVar113);
        uVar6 = vcmpps_avx512vl(auVar53,auVar54,1);
        auVar53 = vsubps_avx512vl(auVar54,auVar124);
        bVar4 = (bool)((byte)uVar6 & 1);
        auVar59._0_4_ = (float)((uint)bVar4 * auVar53._0_4_ | (uint)!bVar4 * auVar54._0_4_);
        bVar4 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar59._4_4_ = (float)((uint)bVar4 * auVar53._4_4_ | (uint)!bVar4 * auVar54._4_4_);
        bVar4 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar59._8_4_ = (float)((uint)bVar4 * auVar53._8_4_ | (uint)!bVar4 * auVar54._8_4_);
        bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar59._12_4_ = (float)((uint)bVar4 * auVar53._12_4_ | (uint)!bVar4 * auVar54._12_4_);
        auVar54 = vfmsub231ps_fma(auVar55,auVar59,auVar126);
        auVar55 = vfnmsub231ps_fma(auVar54,auVar59,auVar128);
        auVar106._0_4_ = auVar55._0_4_ * auVar55._0_4_;
        auVar106._4_4_ = auVar55._4_4_ * auVar55._4_4_;
        auVar106._8_4_ = auVar55._8_4_ * auVar55._8_4_;
        auVar106._12_4_ = auVar55._12_4_ * auVar55._12_4_;
        auVar54 = vfmadd213ps_fma(auVar131,auVar55,auVar130);
        auVar54 = vfmadd213ps_fma(auVar54,auVar55,auVar133);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar37);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar55,auVar38);
        auVar54 = vfmadd213ps_fma(auVar54,auVar55,auVar122);
        auVar54 = vfmadd213ps_fma(auVar54,auVar106,auVar55);
        auVar100._0_4_ = auVar54._0_4_ + 1.0;
        auVar100._4_4_ = auVar54._4_4_ + 1.0;
        auVar100._8_4_ = auVar54._8_4_ + 1.0;
        auVar100._12_4_ = auVar54._12_4_ + 1.0;
        auVar107._0_4_ = (int)auVar59._0_4_;
        auVar107._4_4_ = (int)auVar59._4_4_;
        auVar107._8_4_ = (int)auVar59._8_4_;
        auVar107._12_4_ = (int)auVar59._12_4_;
        auVar54 = vpslld_avx(auVar107,0x17);
        auVar54 = vpaddd_avx512vl(auVar54,auVar39);
        auVar54 = vfmadd213ps_fma(auVar54,auVar100,auVar124);
        auVar54 = vdivps_avx512vl(auVar52,auVar54);
        auVar1 = vfmsub213ps_fma(auVar54,auVar1,auVar1);
        *(undefined1 (*) [16])*pauVar35 = auVar1;
        pauVar35 = (undefined1 (*) [64])(*pauVar35 + 0x10);
        uVar32 = uVar31 + 7;
        uVar31 = uVar31 + 4;
      }
      if (uVar33 - uVar31 != 0 && (int)uVar31 <= (int)uVar33) {
        lVar36 = 0;
        do {
          __x = *(float *)(*pauVar35 + lVar36 * 4);
          fVar97 = expf(__x);
          fVar97 = logf(fVar97 + 1.0);
          fVar97 = tanhf(fVar97);
          *(float *)(*pauVar35 + lVar36 * 4) = fVar97 * __x;
          lVar36 = lVar36 + 1;
        } while (uVar33 - uVar31 != (int)lVar36);
      }
      lVar34 = lVar34 + 1;
      auVar87 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar88 = vmovdqa64_avx512f((undefined1  [64])_ps512_inv_mant_mask);
      auVar89 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar90 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    } while (lVar34 != iVar3);
  }
  return 0;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}